

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O2

void project_m(source origin,wchar_t r,loc grid,wchar_t dam,wchar_t typ,wchar_t flg,_Bool *did_hit,
              _Bool *was_obvious)

{
  byte *pbVar1;
  int16_t *piVar2;
  short sVar3;
  project_monster_handler_f p_Var4;
  monster_group_info group_info;
  loc lVar5;
  mon_messages mVar6;
  _Bool _Var7;
  _Bool _Var8;
  byte bVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  square *psVar14;
  monster_conflict *pmVar15;
  monster *pmVar16;
  monster_race *race;
  monster_race *pmVar17;
  wchar_t i;
  long lVar18;
  undefined1 uVar19;
  wchar_t wVar20;
  anon_enum_32 aVar21;
  uint32_t m;
  char *fmt;
  wchar_t wVar22;
  char cVar23;
  int iVar24;
  wchar_t wVar25;
  bool bVar26;
  source origin_00;
  wchar_t local_118;
  project_monster_handler_context_t local_108;
  loc local_90;
  char m_name [80];
  
  aVar21 = origin.what;
  local_90.x._0_1_ = aVar21 == SRC_PLAYER && (flg & 0x100U) == 0;
  if (aVar21 == SRC_PLAYER) {
    _Var7 = flag_has_dbg((player->state).pflags,10,0x1e,"player->state.pflags","(PF_CHARM)");
    local_108.beguile =
         flag_has_dbg((player->state).pflags,10,0x41,"player->state.pflags","(PF_BEGUILE)");
  }
  else {
    _Var7 = false;
    local_108.beguile = false;
  }
  psVar14 = square(cave,grid);
  sVar3 = psVar14->mon;
  local_108.seen = false;
  local_108.id = (_Bool)(undefined1)local_90.x;
  local_108.mon = (monster *)0x0;
  local_108.lore = (monster_lore *)0x0;
  local_108.obvious = SUB41((uint)(flg & 0x100U) >> 8,0);
  local_108.skipped = false;
  local_108.flag = 0;
  p_Var4 = monster_handlers[typ];
  local_108.do_poly = L'\0';
  local_108.teleport_distance = L'\0';
  local_108.hurt_msg = MON_MSG_NONE;
  local_108.die_msg = MON_MSG_DIE;
  local_108.mon_timed[0] = L'\0';
  local_108.mon_timed[1] = L'\0';
  local_108.mon_timed[2] = L'\0';
  local_108.mon_timed[3] = L'\0';
  local_108.mon_timed[8] = L'\0';
  local_108.mon_timed[9] = L'\0';
  local_108.mon_timed[4] = L'\0';
  local_108.mon_timed[5] = L'\0';
  local_108.mon_timed[6] = L'\0';
  local_108.mon_timed[7] = L'\0';
  *did_hit = false;
  *was_obvious = false;
  local_108.origin.what = aVar21;
  local_108.origin.which = origin.which;
  local_108.r = r;
  local_108.grid = grid;
  local_108.dam = dam;
  local_108.type = typ;
  local_108.charm = _Var7;
  _Var7 = square_ispassable(cave,grid);
  if (sVar3 < 1 || !_Var7) {
    return;
  }
  wVar22 = (wchar_t)sVar3;
  local_118 = origin.which._0_4_;
  if ((aVar21 == SRC_MONSTER) && (local_118 == wVar22)) {
    return;
  }
  pmVar15 = (monster_conflict *)cave_monster(cave,wVar22);
  local_108.lore = get_lore(pmVar15->race);
  local_108.mon = (monster *)pmVar15;
  _Var7 = monster_is_camouflaged((monster *)pmVar15);
  if (_Var7) {
    _Var7 = monster_is_in_view((monster *)pmVar15);
  }
  else {
    _Var7 = monster_is_visible((monster *)pmVar15);
  }
  if (_Var7 != false) {
    local_108.seen = true;
  }
  if (((uint)flg >> 9 & 1) != 0 && aVar21 == SRC_MONSTER) {
    pmVar16 = cave_monster(cave,local_118);
    if (pmVar16 == (monster *)0x0) {
      return;
    }
    if (pmVar16->race == pmVar15->race) {
      return;
    }
  }
  _Var7 = square_isprotect(cave,grid);
  if ((((_Var7) && (uVar10 = Rand_div(4), uVar10 == 0)) &&
      (_Var7 = flag_has_dbg(pmVar15->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE"),
      !_Var7)) && (pmVar15->m_timed[0] == 0)) {
    monster_desc(m_name,0x50,(monster *)pmVar15,L'̔');
    _Var7 = square_isrubble(cave,grid);
    if (_Var7) {
      fmt = "%s ducks behind a boulder!";
LAB_001b8f55:
      msg(fmt,m_name);
      return;
    }
    _Var7 = square_istree(cave,grid);
    if (_Var7) {
      fmt = "%s hides behind a tree!";
      goto LAB_001b8f55;
    }
  }
  _Var7 = monster_is_destroyed((monster *)pmVar15);
  if (_Var7) {
    local_108.die_msg = MON_MSG_DESTROYED;
  }
  if ((((flg & 8U) != 0) && (_Var7 = monster_is_camouflaged((monster *)pmVar15), _Var7)) &&
     (_Var7 = monster_is_in_view((monster *)pmVar15), _Var7)) {
    become_aware((chunk *)cave,pmVar15);
    _Var7 = monster_is_visible((monster *)pmVar15);
    if (_Var7) {
      local_108.seen = true;
    }
  }
  if ((projections[typ].obvious == true) && (local_108.seen == true)) {
    local_108.obvious = true;
  }
  local_108.dam =
       terrain_adjust_dam((player *)0x0,(monster_conflict *)local_108.mon,typ,local_108.dam);
  if (typ != L'>') {
    (*p_Var4)(&local_108);
  }
  if (projections[typ].wake == true) {
    monster_wake(pmVar15,false,L'd');
  }
  pmVar16 = local_108.mon;
  _Var7 = local_108.seen;
  wVar11 = local_108.dam;
  if (local_108.skipped != false) {
    return;
  }
  wVar12 = L'.';
  wVar20 = local_108.hurt_msg;
  mVar6 = local_108.die_msg;
  if (aVar21 == SRC_MONSTER) {
    _Var8 = monster_is_unique(local_108.mon);
    if ((_Var8) && (pmVar16->hp <= wVar11)) {
      wVar11 = (int)pmVar16->hp;
    }
    if ((monster_conflict *)player->upkeep->health_who == (monster_conflict *)pmVar16) {
      pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    monster_wake((monster_conflict *)pmVar16,false,L'\0');
    piVar2 = &pmVar16->hp;
    *piVar2 = *piVar2 - (short)wVar11;
    if (-1 < *piVar2) {
      _Var8 = monster_is_camouflaged(pmVar16);
      if (!_Var8) {
        if ((wVar20 != L'\0' & _Var7) == 1) {
          _Var7 = false;
          goto LAB_001b8ca7;
        }
        if (L'\0' < wVar11) {
          message_pain((monster_conflict *)pmVar16,wVar11);
        }
      }
      goto LAB_001b8cbe;
    }
    if (_Var7 != false) {
      wVar12 = mVar6;
    }
    add_monster_message((monster_conflict *)pmVar16,wVar12,false);
    monster_death((monster_conflict *)pmVar16,player,false);
    delete_monster_idx((chunk *)cave,wVar22);
    pmVar15 = (monster_conflict *)local_108.mon;
    uVar19 = local_108.obvious;
joined_r0x001b8c2e:
    local_108.mon = (monster *)pmVar15;
    local_108.obvious = (_Bool)uVar19;
    if (pmVar15 == (monster_conflict *)0x0) goto LAB_001b8dd6;
  }
  else {
    m_name._0_8_ = m_name._0_8_ & 0xffffffffffffff00;
    if (local_108.origin.what == SRC_PLAYER) {
      cVar23 = (player->opts).opt[3];
      if ((local_108.mon)->hp < local_108.dam) {
        if (local_108.seen != false) {
          wVar12 = local_108.die_msg;
        }
        if ((_Bool)cVar23 == false) goto LAB_001b8b8b;
        add_monster_message_show_damage
                  ((monster_conflict *)local_108.mon,wVar12,false,local_108.dam);
        cVar23 = '\x01';
      }
    }
    else if ((local_108.mon)->hp < local_108.dam) {
      if (local_108.seen != false) {
        wVar12 = local_108.die_msg;
      }
LAB_001b8b8b:
      cVar23 = '\0';
      add_monster_message((monster_conflict *)local_108.mon,wVar12,false);
    }
    else {
      cVar23 = '\0';
    }
    if ((wVar11 != L'\0') &&
       (_Var8 = mon_take_hit((monster_conflict *)pmVar16,player,wVar11,(_Bool *)m_name,""),
       pmVar15 = (monster_conflict *)local_108.mon, uVar19 = local_108.obvious, _Var8))
    goto joined_r0x001b8c2e;
    bVar9 = wVar20 != L'\0' & _Var7;
    if (cVar23 == '\0') {
      if (bVar9 == 0) {
        if (L'\0' < wVar11) {
          message_pain((monster_conflict *)pmVar16,wVar11);
        }
      }
      else {
        add_monster_message((monster_conflict *)pmVar16,wVar20,false);
      }
    }
    else if (bVar9 == 0) {
      if (L'\0' < wVar11) {
        message_pain_show_damage((monster_conflict *)pmVar16,wVar11);
      }
    }
    else {
      add_monster_message_show_damage((monster_conflict *)pmVar16,wVar20,false,wVar11);
    }
    if ((_Var7 != false) && (m_name[0] == '\x01')) {
      wVar20 = L'%';
      _Var7 = true;
LAB_001b8ca7:
      add_monster_message((monster_conflict *)pmVar16,wVar20,_Var7);
    }
LAB_001b8cbe:
    pmVar15 = (monster_conflict *)local_108.mon;
    wVar11 = local_108.type;
    lVar5 = local_108.grid;
    if (local_108.do_poly == L'\0') {
      if (local_108.teleport_distance < L'\x01') {
        for (lVar18 = 0; lVar18 != 10; lVar18 = lVar18 + 1) {
          if ((L'\0' < local_108.mon_timed[lVar18]) &&
             (mon_inc_timed((monster *)pmVar15,(wchar_t)lVar18,local_108.mon_timed[lVar18],
                            local_108.flag | 1), local_108.seen == true)) {
            local_108.obvious = true;
          }
        }
      }
      else {
        strnfmt(m_name,5,"%d");
        origin_00._4_4_ = 0;
        origin_00.what = local_108.origin.what;
        origin_00.which.trap = local_108.origin.which.trap;
        effect_simple(L';',origin_00,m_name,L'\0',L'\0',L'\0',local_108.grid.y,local_108.grid.x,
                      (_Bool *)0x0);
        monster_wake(pmVar15,false,L'\0');
      }
      goto LAB_001b8d80;
    }
    _Var7 = monster_is_unique(local_108.mon);
    if ((_Var7) || (player->upkeep->arena_level == true)) {
joined_r0x001b8d06:
      if (local_108.seen == true) {
        wVar22 = L'\b';
LAB_001b8d0e:
        add_monster_message(pmVar15,wVar22,false);
      }
    }
    else {
      if (local_108.seen == true) {
        local_108.obvious = true;
      }
      uVar10 = 1;
      if (L'\v' < local_108.do_poly) {
        uVar10 = local_108.do_poly + L'\xfffffff6';
      }
      m = 0x5a;
      if (wVar11 == L'4') {
        m = uVar10;
      }
      uVar10 = Rand_div(m);
      wVar20 = uVar10 + L'\x01';
      if (wVar11 == L'4') {
        wVar20 = uVar10 + L'\v';
      }
      if (wVar20 < ((monster *)pmVar15)->race->level) {
        if (local_108.seen == true) {
          wVar22 = L'\b';
          if (wVar11 == L'4') {
            wVar22 = L'3';
          }
          goto LAB_001b8d0e;
        }
      }
      else {
        local_90 = lVar5;
        pmVar17 = ((monster *)pmVar15)->race;
        if (((monster *)pmVar15)->original_race != (monster_race *)0x0) {
          pmVar17 = ((monster *)pmVar15)->original_race;
        }
        if ((pmVar17 == (monster_race *)0x0) || (pmVar17->name == (char *)0x0)) {
          __assert_fail("race && race->name",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/project-mon.c"
                        ,0x32,"struct monster_race *poly_race(struct monster_race *, int)");
        }
        wVar11 = (wchar_t)player->depth;
        _Var7 = flag_has_dbg(pmVar17->flags,0xc,1,"race->flags","RF_UNIQUE");
        if (_Var7) goto joined_r0x001b8d06;
        wVar20 = pmVar17->level;
        wVar12 = (wVar20 * 3) / 4;
        if (wVar20 + L'\xfffffff6' < wVar12) {
          wVar12 = wVar20 + L'\xfffffff6';
        }
        wVar13 = (wVar20 * 5) / 4;
        wVar25 = wVar20 + L'\n';
        if (wVar20 + L'\n' <= wVar13) {
          wVar25 = wVar13;
        }
        uVar10 = Rand_div(100);
        if (uVar10 == 0) {
          wVar25 = L'd';
        }
        iVar24 = 1000;
        do {
          do {
            bVar26 = iVar24 == 0;
            iVar24 = iVar24 + -1;
            if (bVar26) goto joined_r0x001b8d06;
            race = get_mon_num((wVar11 + wVar20) / 2 + L'\x05',wVar11);
          } while ((race == (monster_race *)0x0) || (race == pmVar17));
          _Var7 = flag_has_dbg(race->flags,0xc,1,"new_race->flags","RF_UNIQUE");
        } while (((_Var7) || ((race->level < wVar12 || (wVar25 < race->level)))) ||
                ((_Var7 = flag_has_dbg(race->flags,0xc,0xc,"new_race->flags","RF_FORCE_DEPTH"),
                 _Var7 && (wVar11 < race->level))));
        m_name[0] = '\0';
        m_name[1] = '\0';
        m_name[2] = '\0';
        m_name[3] = '\0';
        m_name[4] = '\0';
        m_name[5] = '\0';
        m_name[6] = '\0';
        m_name[7] = '\0';
        m_name[8] = '\0';
        m_name[9] = '\0';
        m_name[10] = '\0';
        m_name[0xb] = '\0';
        m_name[0xc] = '\0';
        m_name[0xd] = '\0';
        m_name[0xe] = '\0';
        m_name[0xf] = '\0';
        if (local_108.seen == true) {
          add_monster_message(pmVar15,L'\x16',false);
        }
        delete_monster_idx((chunk *)cave,wVar22);
        lVar5 = local_90;
        group_info.player_race = (player_race *)m_name._8_8_;
        group_info._0_8_ = m_name._0_8_;
        place_new_monster((chunk *)cave,local_90,race,false,false,group_info,'\x17');
        local_108.mon = square_monster(cave,lVar5);
        if (((monster_conflict *)local_108.mon != (monster_conflict *)0x0 && local_108.seen == false
            ) && (_Var7 = monster_is_visible(local_108.mon), _Var7)) {
          pmVar15 = (monster_conflict *)local_108.mon;
          wVar22 = L'6';
          goto LAB_001b8d0e;
        }
      }
    }
LAB_001b8d80:
    uVar19 = local_108.obvious;
    pmVar15 = (monster_conflict *)local_108.mon;
    if ((monster_conflict *)local_108.mon == (monster_conflict *)0x0) goto LAB_001b8dd6;
    update_mon((monster_conflict *)local_108.mon,(chunk *)cave,false);
    if (aVar21 == SRC_PLAYER) {
      (((monster *)pmVar15)->target).midx = L'\xffffffff';
    }
  }
  square_light_spot((chunk *)cave,pmVar15->grid);
  if (player->upkeep->monster_race == pmVar15->race) {
    pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
LAB_001b8dd6:
  *did_hit = true;
  *was_obvious = (_Bool)uVar19;
  return;
}

Assistant:

void project_m(struct source origin, int r, struct loc grid, int dam, int typ,
			   int flg, bool *did_hit, bool *was_obvious)
{
	struct monster *mon;
	struct monster_lore *lore;

	/* Is the monster "seen"? */
	bool seen = false;
	bool mon_died = false;

	/* Is the effect obvious? */
	bool obvious = (flg & PROJECT_AWARE ? true : false);

	/* Are we trying to id the source of this effect? */
	bool id = (origin.what == SRC_PLAYER) ? !obvious : false;

	/* Is the source an extra charming player? */
	bool charm = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_CHARM) : false;

	/* Is the source an extra beguiling player? */
	bool beguile = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_BEGUILE) : false;

	int m_idx = square(cave, grid)->mon;

	project_monster_handler_f monster_handler = monster_handlers[typ];
	project_monster_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		seen,
		id,
		NULL, /* mon */
		NULL, /* lore */
		charm,
		beguile,
		obvious,
		false, /* skipped */
		0, /* flag */
		0, /* do_poly */
		0, /* teleport_distance */
		MON_MSG_NONE, /* hurt_msg */
		MON_MSG_DIE, /* die_msg */
		{0, 0, 0, 0, 0, 0},
	};

	*did_hit = false;
	*was_obvious = false;

	/* Walls protect monsters */
	if (!square_ispassable(cave, grid)) return;

	/* No monster here */
	if (!(m_idx > 0)) return;

	/* Never affect projector */
	if (origin.what == SRC_MONSTER && origin.which.monster == m_idx) return;

	/* Obtain monster info */
	mon = cave_monster(cave, m_idx);
	lore = get_lore(mon->race);
	context.mon = mon;
	context.lore = lore;

	/* See visible monsters */
	if (monster_is_camouflaged(mon)) {
		if (monster_is_in_view(mon)) {
			seen = true;
			context.seen = true;
		}
	} else if (monster_is_visible(mon)) {
		seen = true;
		context.seen = seen;
	}

	/* Breathers may not blast members of the same race. */
	if (origin.what == SRC_MONSTER && (flg & PROJECT_SAFE)) {
		/* Point to monster information of caster */
		struct monster *caster = cave_monster(cave, origin.which.monster);
		if (!caster) return;

		/* Skip monsters with the same race */
		if (caster->race == mon->race)
			return;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		if (one_in_(4) && !rf_has(mon->race->flags, RF_NEVER_MOVE) &&
			!mon->m_timed[MON_TMD_SLEEP]) {
			char m_name[80];

			/* Get the monster name (or "it") */
			monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

			/* Monsters can duck behind rubble */
			if (square_isrubble(cave, grid)) {
				msg("%s ducks behind a boulder!", m_name);
				return;
			}

			if (square_istree(cave, grid)) {
				msg("%s hides behind a tree!", m_name);
				return;
			}
		}
	}

	/* Some monsters get "destroyed" */
	if (monster_is_destroyed(mon))
		context.die_msg = MON_MSG_DESTROYED;

	/* Reveal a camouflaged monster if in view and it stopped an effect. */
	if ((flg & PROJECT_STOP) && monster_is_camouflaged(mon)
			&& monster_is_in_view(mon)) {
		become_aware(cave, mon);
		/* Reevaluate whether it's seen. */
		if (monster_is_visible(mon)) {
			seen = true;
			context.seen = true;
		}
	}

	/* Force obviousness for certain types if seen. */
	if (projections[typ].obvious && context.seen)
		context.obvious = true;

	/* Adjust damage for terrain */
	context.dam = terrain_adjust_dam(NULL, context.mon, typ, context.dam);

	if (monster_handler != NULL)
		monster_handler(&context);

	/* Wake monster if required */
	if (projections[typ].wake)
		monster_wake(mon, false, 100);

	/* Absolutely no effect */
	if (context.skipped) return;

	/* Apply damage to the monster, based on who did the damage. */
	if (origin.what == SRC_MONSTER) {
		mon_died = project_m_monster_attack(&context, m_idx);
	} else {
		mon_died = project_m_player_attack(&context);
	}

	if (!mon_died) {
		project_m_apply_side_effects(&context, m_idx);
	}

	/* Update locals, since the project_m_* functions can change some values. */
	mon = context.mon;
	obvious = context.obvious;

	/* Check for NULL, since polymorph can occasionally return NULL. */
	if (mon != NULL) {
		/* Update the monster */
		if (!mon_died) {
			update_mon(mon, cave, false);

			/* Become hostile (to the player only, for now) */
			if (origin.what == SRC_PLAYER) {
				mon->target.midx = -1;
			}
		}

		/* Redraw the (possibly new) monster grid */
		square_light_spot(cave, mon->grid);

		/* Update monster recall window */
		if (player->upkeep->monster_race == mon->race) {
			/* Window stuff */
			player->upkeep->redraw |= (PR_MONSTER);
		}
	}

	/* Track it */
	*did_hit = true;

	/* Return "Anything seen?" */
	*was_obvious = !!obvious;
}